

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

InlineCache * __thiscall Js::FunctionBody::GetInlineCache(FunctionBody *this,uint index)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uchar *puVar5;
  
  if ((this->inlineCaches).ptr == (void **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x18bf,"(this->inlineCaches != nullptr)",
                                "this->inlineCaches != nullptr");
    if (!bVar2) goto LAB_006d3634;
    *puVar4 = 0;
  }
  uVar3 = GetInlineCacheCount(this);
  if (uVar3 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x18c0,"(index < this->GetInlineCacheCount())",
                                "index < this->GetInlineCacheCount()");
    if (!bVar2) goto LAB_006d3634;
    *puVar4 = 0;
  }
  puVar5 = (this->m_inlineCacheTypes).ptr;
  if (1 < puVar5[index]) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x18c3,
                                "(this->m_inlineCacheTypes[index] == 0x00 || this->m_inlineCacheTypes[index] == 0x01)"
                                ,
                                "this->m_inlineCacheTypes[index] == InlineCacheTypeNone || this->m_inlineCacheTypes[index] == InlineCacheTypeInlineCache"
                               );
    if (!bVar2) {
LAB_006d3634:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    puVar5 = (this->m_inlineCacheTypes).ptr;
  }
  puVar5[index] = '\x01';
  return (InlineCache *)(this->inlineCaches).ptr[index];
}

Assistant:

InlineCache *FunctionBody::GetInlineCache(uint index)
    {
        Assert(this->inlineCaches != nullptr);
        Assert(index < this->GetInlineCacheCount());
#if DBG
        Assert(this->m_inlineCacheTypes[index] == InlineCacheTypeNone ||
            this->m_inlineCacheTypes[index] == InlineCacheTypeInlineCache);
        this->m_inlineCacheTypes[index] = InlineCacheTypeInlineCache;
#endif
        return reinterpret_cast<InlineCache *>(this->inlineCaches[index]);
    }